

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall
KokkosTools::SpaceTimeStack::State::allocate
          (State *this,Space space,char *name,void *ptr,uint64_t size)

{
  allocator<char> local_51;
  string local_50;
  uint64_t local_30;
  uint64_t size_local;
  void *ptr_local;
  char *name_local;
  State *pSStack_10;
  Space space_local;
  State *this_local;
  
  local_30 = size;
  size_local = (uint64_t)ptr;
  ptr_local = name;
  name_local._4_4_ = space;
  pSStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  Allocations::allocate
            (this->current_allocations + space,&local_50,(void *)size_local,local_30,
             this->stack_frame);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (this->hwm_allocations[name_local._4_4_].total_size <
      this->current_allocations[name_local._4_4_].total_size) {
    Allocations::operator=
              (this->hwm_allocations + name_local._4_4_,this->current_allocations + name_local._4_4_
              );
  }
  return;
}

Assistant:

void allocate(Space space, const char* name, const void* ptr,
                std::uint64_t size) {
    current_allocations[space].allocate(std::string(name), ptr, size,
                                        stack_frame);
    if (current_allocations[space].total_size >
        hwm_allocations[space].total_size) {
      hwm_allocations[space] = current_allocations[space];
    }
  }